

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

VALUE_TYPE Diligent::ComponentTypeToValueType(COMPONENT_TYPE CompType,Uint32 Size)

{
  VALUE_TYPE local_31;
  VALUE_TYPE local_25;
  Uint32 Size_local;
  COMPONENT_TYPE CompType_local;
  
  switch(CompType) {
  case COMPONENT_TYPE_UNDEFINED:
    return VT_UNDEFINED;
  case COMPONENT_TYPE_FLOAT:
    if (Size == 2) {
      return VT_FLOAT16;
    }
    if (Size == 4) {
      return VT_FLOAT32;
    }
    if (Size == 8) {
      return VT_FLOAT64;
    }
    break;
  case COMPONENT_TYPE_SNORM:
    if (Size == 1) {
      return VT_INT8;
    }
    if (Size == 2) {
      return VT_INT16;
    }
    break;
  case COMPONENT_TYPE_UNORM:
    if (Size == 1) {
      return VT_UINT8;
    }
    if (Size == 2) {
      return VT_UINT16;
    }
    break;
  case COMPONENT_TYPE_UNORM_SRGB:
    local_25 = VT_UINT8;
    if (Size != 1) {
      local_25 = VT_UNDEFINED;
    }
    return local_25;
  case COMPONENT_TYPE_SINT:
    if (Size == 1) {
      return VT_INT8;
    }
    if (Size == 2) {
      return VT_INT16;
    }
    if (Size == 4) {
      return VT_INT32;
    }
    break;
  case COMPONENT_TYPE_UINT:
    if (Size == 1) {
      return VT_UINT8;
    }
    if (Size == 2) {
      return VT_UINT16;
    }
    if (Size == 4) {
      return VT_UINT32;
    }
    break;
  case COMPONENT_TYPE_DEPTH:
    local_31 = VT_FLOAT32;
    if (Size != 4) {
      local_31 = VT_UNDEFINED;
    }
    return local_31;
  }
  return VT_UNDEFINED;
}

Assistant:

VALUE_TYPE ComponentTypeToValueType(COMPONENT_TYPE CompType, Uint32 Size)
{
    switch (CompType)
    {
        case COMPONENT_TYPE_UNDEFINED:
            return VT_UNDEFINED;

        case COMPONENT_TYPE_FLOAT:
            switch (Size)
            {
                case 2: return VT_FLOAT16;
                case 4: return VT_FLOAT32;
                case 8: return VT_FLOAT64;
            }
            break;

        case COMPONENT_TYPE_SNORM:
            switch (Size)
            {
                case 1: return VT_INT8;
                case 2: return VT_INT16;
            }
            break;

        case COMPONENT_TYPE_UNORM:
            switch (Size)
            {
                case 1: return VT_UINT8;
                case 2: return VT_UINT16;
            }
            break;

        case COMPONENT_TYPE_UNORM_SRGB:
            return Size == 1 ? VT_UINT8 : VT_UNDEFINED;

        case COMPONENT_TYPE_SINT:
            switch (Size)
            {
                case 1: return VT_INT8;
                case 2: return VT_INT16;
                case 4: return VT_INT32;
            }
            break;

        case COMPONENT_TYPE_UINT:
            switch (Size)
            {
                case 1: return VT_UINT8;
                case 2: return VT_UINT16;
                case 4: return VT_UINT32;
            }
            break;

        case COMPONENT_TYPE_DEPTH:
            return Size == 4 ? VT_FLOAT32 : VT_UNDEFINED;

        default:
            break;
    }

    return VT_UNDEFINED;
}